

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O3

RC __thiscall QL_NodeRel::OpenIt(QL_NodeRel *this)

{
  QL_Manager *pQVar1;
  int extraout_EAX;
  int iVar2;
  RC RVar3;
  
  (this->super_QL_Node).isOpen = true;
  pQVar1 = (this->super_QL_Node).qlm;
  if (this->useIndex == true) {
    IX_Manager::DestroyIndex(pQVar1->ixm);
    if (extraout_EAX != 0) {
      return extraout_EAX;
    }
    iVar2 = yyparse();
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = RM_Manager::OpenFile(((this->super_QL_Node).qlm)->rmm,this->relName,&this->fh);
  }
  else {
    RVar3 = RM_Manager::OpenFile(pQVar1->rmm,this->relName,&this->fh);
    if (RVar3 != 0) {
      return RVar3;
    }
    iVar2 = RM_FileScan::OpenScan(&this->fs,&this->fh,INT,4,0,NO_OP,(void *)0x0,NO_HINT);
  }
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

RC QL_NodeRel::OpenIt(){
  RC rc = 0;
  isOpen = true;
  if(useIndex){
    if((rc = qlm.ixm.OpenIndex(relName, indexNo, ih)))
      return (rc);
    if((rc = is.OpenScan(ih, EQ_OP, value)))
      return (rc);
    if((rc = qlm.rmm.OpenFile(relName, fh)))
      return (rc);
  }
  else{
    if((rc = qlm.rmm.OpenFile(relName, fh)))
      return (rc);
    if((rc = fs.OpenScan(fh, INT, 4, 0, NO_OP, NULL)))
      return (rc);
  }
  return (0);
}